

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::buildTest(InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this)

{
  VariableP<tcu::Matrix<float,_2,_3>_> *this_00;
  VariableP<tcu::Vector<float,_3>_> *this_01;
  VariableP<vkt::shaderexecutor::Void> *this_02;
  VariableP<vkt::shaderexecutor::Void> *this_03;
  ExprP<tcu::Matrix<float,_2,_3>_> expr;
  allocator<char> local_69;
  SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_> local_68;
  string local_58;
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out0",&local_69);
  variable<tcu::Matrix<float,2,3>>((shaderexecutor *)&local_68,&local_58);
  this_00 = &(this->m_variables).out0;
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::operator=
            (&this_00->
              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>,
             &local_68);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::release(&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out1",&local_69);
  variable<tcu::Vector<float,3>>((shaderexecutor *)&local_68,&local_58);
  this_01 = &(this->m_variables).out1;
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>::operator=
            (&this_01->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
             ,(SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_> *)&local_68);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_> *)&local_68);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in0",&local_69);
  variable<tcu::Vector<float,2>>((shaderexecutor *)&local_68,&local_58);
  local_38 = &this->m_variables;
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator=
            ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_> *)local_38,
             (SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_> *)&local_68);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_> *)&local_68);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in1",&local_69);
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_68,&local_58);
  this_02 = &(this->m_variables).in1;
  de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::operator=
            (&this_02->
              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>,
             (SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)&local_68
            );
  de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)&local_68
            );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in2",&local_69);
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_68,&local_58);
  this_03 = &(this->m_variables).in2;
  de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::operator=
            (&this_03->
              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>,
             (SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)&local_68
            );
  de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)&local_68
            );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in3",&local_69);
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_68,&local_58);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::operator=
            (&(this->m_variables).in3.
              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>,
             (SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)&local_68
            );
  de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_> *)&local_68
            );
  std::__cxx11::string::~string((string *)&local_58);
  applyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,2,3>,tcu::Vector<float,2>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((shaderexecutor *)&local_58,this->m_func,&local_38->in0,this_01,this_02,this_03);
  variableAssignment<tcu::Matrix<float,2,3>>
            ((shaderexecutor *)&local_68,this_00,(ExprP<tcu::Matrix<float,_2,_3>_> *)&local_58);
  de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator=
            (&(this->super_FuncCaseBase).m_stmt.
              super_SharedPtr<const_vkt::shaderexecutor::Statement>,
             (SharedPtr<const_vkt::shaderexecutor::Statement> *)&local_68);
  de::SharedPtr<const_vkt::shaderexecutor::Statement>::~SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Statement> *)&local_68);
  PrecisionCase::
  testStatement<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>,vkt::shaderexecutor::OutTypes<tcu::Matrix<float,2,3>,tcu::Vector<float,3>>>
            ((PrecisionCase *)this,local_38,
             (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>
             .m_ptr);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_3>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_3>_>_> *)&local_58);
  return;
}

Assistant:

void InOutFuncCase<Sig>::buildTest (void)
{

	m_variables.out0	= variable<Ret>("out0");
	m_variables.out1	= variable<Arg1>("out1");
	m_variables.in0		= variable<Arg0>("in0");
	m_variables.in1		= variable<Arg2>("in1");
	m_variables.in2		= variable<Arg3>("in2");
	m_variables.in3		= variable<Void>("in3");

	{
		ExprP<Ret> expr	= applyVar(m_func, m_variables.in0, m_variables.out1, m_variables.in1, m_variables.in2);
		m_stmt			= variableAssignment(m_variables.out0, expr);

		this->testStatement(m_variables, *m_stmt);
	}
}